

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_20.cpp
# Opt level: O2

void gl_SetTextureMode(int type)

{
  GLint GVar1;
  GLenum GVar2;
  
  switch(type) {
  case 1:
    (*_ptrc_glTexEnvi)(0x2300,0x2200,0x8570);
    (*_ptrc_glTexEnvi)(0x2300,0x8571,0x1e01);
    (*_ptrc_glTexEnvi)(0x2300,0x8580,0x8577);
    GVar2 = 0x8590;
    break;
  case 2:
    (*_ptrc_glTexEnvi)(0x2300,0x2200,0x8570);
    (*_ptrc_glTexEnvi)(0x2300,0x8571,0x2100);
    (*_ptrc_glTexEnvi)(0x2300,0x8580,0x84c0);
    (*_ptrc_glTexEnvi)(0x2300,0x8581,0x8577);
    GVar1 = 0x300;
    goto LAB_0038828e;
  case 3:
    (*_ptrc_glTexEnvi)(0x2300,0x2200,0x8570);
    (*_ptrc_glTexEnvi)(0x2300,0x8571,0x2100);
    (*_ptrc_glTexEnvi)(0x2300,0x8580,0x84c0);
    (*_ptrc_glTexEnvi)(0x2300,0x8581,0x8577);
    (*_ptrc_glTexEnvi)(0x2300,0x8590,0x301);
    GVar2 = 0x8591;
    break;
  default:
    GVar2 = 0x2200;
    GVar1 = 0x2100;
    goto LAB_003882d5;
  case 6:
    (*_ptrc_glTexEnvi)(0x2300,0x2200,0x8570);
    (*_ptrc_glTexEnvi)(0x2300,0x8571,0x2100);
    (*_ptrc_glTexEnvi)(0x2300,0x8580,0x84c0);
    (*_ptrc_glTexEnvi)(0x2300,0x8581,0x8577);
    GVar1 = 0x301;
LAB_0038828e:
    (*_ptrc_glTexEnvi)(0x2300,0x8590,GVar1);
    (*_ptrc_glTexEnvi)(0x2300,0x8591,0x300);
    (*_ptrc_glTexEnvi)(0x2300,0x8572,0x1e01);
    (*_ptrc_glTexEnvi)(0x2300,0x8588,0x8577);
    GVar2 = 0x8598;
    goto LAB_003882d0;
  }
  (*_ptrc_glTexEnvi)(0x2300,GVar2,0x300);
  (*_ptrc_glTexEnvi)(0x2300,0x8572,0x2100);
  (*_ptrc_glTexEnvi)(0x2300,0x8588,0x8577);
  (*_ptrc_glTexEnvi)(0x2300,0x8589,0x84c0);
  (*_ptrc_glTexEnvi)(0x2300,0x8598,0x302);
  GVar2 = 0x8599;
LAB_003882d0:
  GVar1 = 0x302;
LAB_003882d5:
  (*_ptrc_glTexEnvi)(0x2300,GVar2,GVar1);
  return;
}

Assistant:

void gl_SetTextureMode(int type)
{
	static float white[] = {1.f,1.f,1.f,1.f};

	if (type == TM_MASK)
	{
		glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_COMBINE);
		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_RGB, GL_REPLACE);
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_RGB, GL_PRIMARY_COLOR);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND0_RGB, GL_SRC_COLOR);

		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA, GL_MODULATE); 
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA, GL_PRIMARY_COLOR);
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_ALPHA, GL_TEXTURE0);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND0_ALPHA, GL_SRC_ALPHA);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND1_ALPHA, GL_SRC_ALPHA);
	}
	else if (type == TM_OPAQUE)
	{
		glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_COMBINE);
		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_RGB, GL_MODULATE);
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_RGB, GL_TEXTURE0);
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_RGB, GL_PRIMARY_COLOR);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND0_RGB, GL_SRC_COLOR);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND1_RGB, GL_SRC_COLOR);

		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA, GL_REPLACE); 
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA, GL_PRIMARY_COLOR);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND0_ALPHA, GL_SRC_ALPHA);
	}
	else if (type == TM_INVERSE)
	{
		glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_COMBINE);
		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_RGB, GL_MODULATE);
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_RGB, GL_TEXTURE0);
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_RGB, GL_PRIMARY_COLOR);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND0_RGB, GL_ONE_MINUS_SRC_COLOR);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND1_RGB, GL_SRC_COLOR);

		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA, GL_MODULATE); 
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA, GL_PRIMARY_COLOR);
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_ALPHA, GL_TEXTURE0);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND0_ALPHA, GL_SRC_ALPHA);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND1_ALPHA, GL_SRC_ALPHA);
	}
	else if (type == TM_INVERTOPAQUE)
	{
		glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_COMBINE);
		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_RGB, GL_MODULATE);
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_RGB, GL_TEXTURE0);
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_RGB, GL_PRIMARY_COLOR);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND0_RGB, GL_ONE_MINUS_SRC_COLOR);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND1_RGB, GL_SRC_COLOR);

		glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA, GL_REPLACE); 
		glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA, GL_PRIMARY_COLOR);
		glTexEnvi(GL_TEXTURE_ENV, GL_OPERAND0_ALPHA, GL_SRC_ALPHA);
	}
	else // if (type == TM_MODULATE)
	{
		glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);
	}
}